

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O3

NameSet * __thiscall
wasm::BranchUtils::BranchSeekerCache::getBranches(BranchSeekerCache *this,Expression *curr)

{
  Index IVar1;
  iterator iVar2;
  Expression ***pppEVar3;
  NameSet *extraout_RDX;
  NameSet *extraout_RDX_00;
  NameSet *extraout_RDX_01;
  anon_class_8_1_ba1d7401 func;
  NameSet *extraout_RDX_02;
  Index index;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *this_00;
  Index IVar4;
  undefined1 auStack_1b8 [8];
  NameSet selfBranches;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_e0;
  AbstractChildIterator<wasm::ChildIterator> local_b0;
  Expression *local_70;
  Expression *child;
  NameSet currBranches;
  Expression *curr_local;
  
  currBranches._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)curr;
  iVar2 = std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,(key_type *)&currBranches._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  if (iVar2.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&currBranches;
    currBranches._M_t._M_impl._0_4_ = 0;
    currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    currBranches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
              (&local_b0,(Expression *)currBranches._M_t._M_impl.super__Rb_tree_header._M_node_count
              );
    IVar4 = (int)((ulong)((long)local_b0.children.flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_b0.children.flexible.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) +
            (int)local_b0.children.usedFixed;
    func.ret = extraout_RDX;
    if (IVar4 != 0) {
      index = 0;
      do {
        IVar1 = AbstractChildIterator<wasm::ChildIterator>::mapIndex(&local_b0,index);
        pppEVar3 = local_b0.children.flexible.
                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_start + ((ulong)IVar1 - 4);
        if (IVar1 < 4) {
          pppEVar3 = local_b0.children.fixed._M_elems + IVar1;
        }
        local_70 = **pppEVar3;
        iVar2 = std::
                _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)this,&local_70);
        if (iVar2.
            super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          auStack_1b8 = (undefined1  [8])0x0;
          selfBranches._M_t._M_impl._0_8_ = 0;
          local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_e0._M_impl.super__Rb_tree_header._M_header;
          local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
               local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
          Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
          ::walk((Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
                  *)auStack_1b8,&local_70);
          if (currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0)
          {
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::swap((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)&child,&local_e0);
          }
          else {
            std::
            _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<wasm::Name>>
                      ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                        *)&child,
                       (_Rb_tree_const_iterator<wasm::Name>)
                       local_e0._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<wasm::Name>)&local_e0._M_impl.super__Rb_tree_header)
            ;
          }
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree(&local_e0);
          func.ret = extraout_RDX_01;
        }
        else {
          if (currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0)
          {
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::swap((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)&child,
                   (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)((long)iVar2.
                             super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
                             ._M_cur + 0x10));
          }
          else {
            std::
            _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<wasm::Name>>
                      ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                        *)&child,
                       *(_Base_ptr *)
                        ((long)iVar2.
                               super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
                               ._M_cur + 0x28),
                       (_Base_ptr)
                       ((long)iVar2.
                              super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
                              ._M_cur + 0x18));
          }
          std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::erase((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)this,(const_iterator)
                          iVar2.
                          super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
                          ._M_cur);
          func.ret = extraout_RDX_00;
        }
        index = index + 1;
      } while (IVar4 != index);
    }
    if (local_b0.children.flexible.
        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.children.flexible.
                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b0.children.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.children.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      func.ret = extraout_RDX_02;
    }
    selfBranches._M_t._M_impl._0_8_ = selfBranches._M_t._M_impl._0_8_ & 0xffffffff00000000;
    selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&selfBranches;
    selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&selfBranches;
    operateOnScopeNameUses<wasm::BranchUtils::getUniqueTargets(wasm::Expression*)::_lambda(wasm::Name&)_1_>
              ((BranchUtils *)currBranches._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (Expression *)auStack_1b8,func);
    if (currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0) {
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::swap((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              *)&child,
             (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              *)auStack_1b8);
    }
    else {
      std::
      _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<wasm::Name>>
                ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                  *)&child,
                 (_Rb_tree_const_iterator<wasm::Name>)
                 selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                 (_Base_ptr)&selfBranches);
    }
    this_00 = &std::__detail::
               _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,(key_type *)
                                    &currBranches._M_t._M_impl.super__Rb_tree_header._M_node_count)
               ->_M_t;
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::clear(this_00);
    if (currBranches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
      (this_00->_M_impl).super__Rb_tree_header._M_header._M_color = currBranches._M_t._M_impl._0_4_;
      (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)currBranches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
      (this_00->_M_impl).super__Rb_tree_header._M_header._M_left =
           currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (this_00->_M_impl).super__Rb_tree_header._M_header._M_right =
           currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      *(_Rb_tree_header **)(currBranches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 8) =
           &(this_00->_M_impl).super__Rb_tree_header;
      (this_00->_M_impl).super__Rb_tree_header._M_node_count =
           (size_t)currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      currBranches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&currBranches
      ;
      currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&currBranches;
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)auStack_1b8);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&child);
  }
  else {
    this_00 = (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)((long)iVar2.
                        super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
                        ._M_cur + 0x10);
  }
  return (NameSet *)this_00;
}

Assistant:

const NameSet& getBranches(Expression* curr) {
    auto iter = branches.find(curr);
    if (iter != branches.end()) {
      return iter->second;
    }
    NameSet currBranches;
    auto add = [&](NameSet& moreBranches) {
      // Make sure to do a fast swap for the first set of branches to arrive.
      // This helps the case of the first child being a block with a very large
      // set of names.
      if (currBranches.empty()) {
        currBranches.swap(moreBranches);
      } else {
        currBranches.insert(moreBranches.begin(), moreBranches.end());
      }
    };
    // Add from the children, which are hopefully cached.
    for (auto child : ChildIterator(curr)) {
      auto iter = branches.find(child);
      if (iter != branches.end()) {
        add(iter->second);
        // We are scanning the parent, which means we assume the child will
        // never be visited again.
        branches.erase(iter);
      } else {
        // The child was not cached. Scan it manually.
        BranchAccumulator childBranches;
        childBranches.walk(child);
        add(childBranches.branches);
        // Don't bother caching anything - we are scanning the parent, so the
        // child will presumably not be scanned again.
      }
    }
    // Finish with the parent's own branches.
    auto selfBranches = getUniqueTargets(curr);
    add(selfBranches);
    return branches[curr] = std::move(currBranches);
  }